

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

ValueUnion Assimp::PLY::PropertyInstance::DefaultValue(EDataType eType)

{
  ValueUnion VStack_10;
  EDataType eType_local;
  ValueUnion out;
  
  if (eType == EDT_Float) {
    VStack_10 = (ValueUnion)((ulong)eType_local << 0x20);
  }
  else if (eType == EDT_Double) {
    VStack_10.fDouble = 0.0;
  }
  else {
    VStack_10 = (ValueUnion)((ulong)eType_local << 0x20);
  }
  return (ValueUnion)VStack_10.fDouble;
}

Assistant:

PLY::PropertyInstance::ValueUnion PLY::PropertyInstance::DefaultValue(PLY::EDataType eType)
{
  PLY::PropertyInstance::ValueUnion out;

  switch (eType)
  {
  case EDT_Float:
    out.fFloat = 0.f;
    return out;

  case EDT_Double:
    out.fDouble = 0.;
    return out;

  default:;
  };
  out.iUInt = 0;
  return out;
}